

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

int Wln_ObjDup(Wln_Ntk_t *pNew,Wln_Ntk_t *p,int iObj)

{
  Vec_Int_t *p_00;
  int iObj_00;
  int iVar1;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar2;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar3;
  int iVar4;
  
  iObj_00 = Wln_ObjClone(pNew,p,iObj);
  for (iVar4 = 0; iVar4 < p->vFanins[iObj].nSize; iVar4 = iVar4 + 1) {
    iVar1 = Wln_ObjFanin(p,iObj,iVar4);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(&p->vCopies,iVar1);
      Wln_ObjAddFanin(pNew,iObj_00,iVar1);
    }
  }
  p_00 = &p->vTypes;
  iVar4 = Vec_IntEntry(p_00,iObj);
  if (iVar4 == 0x61) {
    paVar2 = &p->vFanins[iObj].field_2;
    if (2 < p->vFanins[iObj].nSize) {
      paVar2 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar2->pArray[0];
    }
    Wln_ObjSetConst(pNew,iObj_00,paVar2->Array[0]);
  }
  else {
    iVar4 = Vec_IntEntry(p_00,iObj);
    if (iVar4 != 0x5b) {
      iVar4 = Vec_IntEntry(p_00,iObj);
      if (iVar4 != 0x48) {
        iVar4 = Vec_IntEntry(p_00,iObj);
        if (iVar4 != 0x49) {
          iVar4 = Vec_IntEntry(p_00,iObj);
          if (iVar4 != 0x4d) goto LAB_0031d02c;
        }
      }
    }
    paVar2 = &p->vFanins[iObj].field_2;
    if (2 < p->vFanins[iObj].nSize) {
      paVar2 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar2->pArray[0];
    }
    paVar3 = &pNew->vFanins[iObj_00].field_2;
    if (2 < pNew->vFanins[iObj_00].nSize) {
      paVar3 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar3->pArray[0];
    }
    paVar3->Array[1] = paVar2->Array[1];
  }
LAB_0031d02c:
  Vec_IntWriteEntry(&p->vCopies,iObj,iObj_00);
  return iObj_00;
}

Assistant:

int Wln_ObjDup( Wln_Ntk_t * pNew, Wln_Ntk_t * p, int iObj )
{
    int i, iFanin, iObjNew = Wln_ObjClone( pNew, p, iObj );
    Wln_ObjForEachFanin( p, iObj, iFanin, i )
        Wln_ObjAddFanin( pNew, iObjNew, Wln_ObjCopy(p, iFanin) );
    if ( Wln_ObjIsConst(p, iObj) )
        Wln_ObjSetConst( pNew, iObjNew, Wln_ObjFanin0(p, iObj) );
    else if ( Wln_ObjIsSlice(p, iObj) || Wln_ObjIsRotate(p, iObj) || Wln_ObjIsTable(p, iObj) )
        Wln_ObjSetFanin( pNew, iObjNew, 1, Wln_ObjFanin1(p, iObj) );
    Wln_ObjSetCopy( p, iObj, iObjNew );
    return iObjNew;
}